

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftcalc.c
# Opt level: O0

void FT_Matrix_Multiply_Scaled(FT_Matrix *a,FT_Matrix *b,FT_Long scaling)

{
  long c_;
  FT_Long FVar1;
  FT_Long FVar2;
  FT_Long FVar3;
  FT_Long FVar4;
  FT_Long FVar5;
  FT_Long FVar6;
  FT_Long FVar7;
  FT_Long FVar8;
  FT_Long val;
  FT_Fixed yy;
  FT_Fixed yx;
  FT_Fixed xy;
  FT_Fixed xx;
  FT_Long scaling_local;
  FT_Matrix *b_local;
  FT_Matrix *a_local;
  
  c_ = scaling << 0x10;
  if ((a != (FT_Matrix *)0x0) && (b != (FT_Matrix *)0x0)) {
    FVar1 = FT_MulDiv(a->xx,b->xx,c_);
    FVar2 = FT_MulDiv(a->xy,b->yx,c_);
    FVar3 = FT_MulDiv(a->xx,b->xy,c_);
    FVar4 = FT_MulDiv(a->xy,b->yy,c_);
    FVar5 = FT_MulDiv(a->yx,b->xx,c_);
    FVar6 = FT_MulDiv(a->yy,b->yx,c_);
    FVar7 = FT_MulDiv(a->yx,b->xy,c_);
    FVar8 = FT_MulDiv(a->yy,b->yy,c_);
    b->xx = FVar1 + FVar2;
    b->xy = FVar3 + FVar4;
    b->yx = FVar5 + FVar6;
    b->yy = FVar7 + FVar8;
  }
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_Matrix_Multiply_Scaled( const FT_Matrix*  a,
                             FT_Matrix        *b,
                             FT_Long           scaling )
  {
    FT_Fixed  xx, xy, yx, yy;

    FT_Long   val = 0x10000L * scaling;


    if ( !a || !b )
      return;

    xx = ADD_LONG( FT_MulDiv( a->xx, b->xx, val ),
                   FT_MulDiv( a->xy, b->yx, val ) );
    xy = ADD_LONG( FT_MulDiv( a->xx, b->xy, val ),
                   FT_MulDiv( a->xy, b->yy, val ) );
    yx = ADD_LONG( FT_MulDiv( a->yx, b->xx, val ),
                   FT_MulDiv( a->yy, b->yx, val ) );
    yy = ADD_LONG( FT_MulDiv( a->yx, b->xy, val ),
                   FT_MulDiv( a->yy, b->yy, val ) );

    b->xx = xx;
    b->xy = xy;
    b->yx = yx;
    b->yy = yy;
  }